

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O1

int vs_start(bitstream *str,uint32_t *val)

{
  uint8_t uVar1;
  byte bVar2;
  uint32_t uVar3;
  uint in_EAX;
  int iVar4;
  int iVar5;
  long lVar6;
  uint8_t *puVar7;
  int iVar8;
  uint uVar9;
  long lVar10;
  int iVar11;
  int bit;
  undefined8 uStack_38;
  
  if ((str->type & ~VS_H263) == VS_H261) {
    uVar9 = (uint)(str->type == VS_H261);
    uStack_38 = (ulong)in_EAX;
    while (str->zero_bits < (int)(0x10 - uVar9)) {
      iVar4 = vs_bit(str,(uint32_t *)((long)&uStack_38 + 4));
      if (iVar4 != 0) {
        return 1;
      }
      if (uStack_38._4_4_ != 0) {
        vs_start_cold_1();
        return 1;
      }
    }
    do {
      if (uStack_38._4_4_ != 0) {
        iVar4 = vs_u(str,val,uVar9 ^ 5);
        return iVar4;
      }
      uStack_38 = CONCAT44(1,(undefined4)uStack_38);
      iVar4 = vs_bit(str,(uint32_t *)((long)&uStack_38 + 4));
    } while (iVar4 == 0);
  }
  else if (str->bitpos == 7) {
    if (str->dir == VS_ENCODE) {
      iVar4 = str->bytesmax;
      if (iVar4 <= str->bytesnum) {
        iVar5 = 0x10;
        if (iVar4 != 0) {
          iVar5 = iVar4 * 2;
        }
        str->bytesmax = iVar5;
        puVar7 = (uint8_t *)realloc(str->bytes,(long)iVar5);
        str->bytes = puVar7;
      }
      iVar4 = str->bytesnum;
      str->bytesnum = iVar4 + 1;
      str->bytes[iVar4] = '\0';
      iVar4 = str->bytesmax;
      if (iVar4 <= str->bytesnum) {
        iVar5 = 0x10;
        if (iVar4 != 0) {
          iVar5 = iVar4 * 2;
        }
        str->bytesmax = iVar5;
        puVar7 = (uint8_t *)realloc(str->bytes,(long)iVar5);
        str->bytes = puVar7;
      }
      iVar4 = str->bytesnum;
      str->bytesnum = iVar4 + 1;
      str->bytes[iVar4] = '\0';
      iVar4 = str->bytesmax;
      if (iVar4 <= str->bytesnum) {
        iVar5 = 0x10;
        if (iVar4 != 0) {
          iVar5 = iVar4 * 2;
        }
        str->bytesmax = iVar5;
        puVar7 = (uint8_t *)realloc(str->bytes,(long)iVar5);
        str->bytes = puVar7;
      }
      iVar4 = str->bytesnum;
      str->bytesnum = iVar4 + 1;
      str->bytes[iVar4] = '\x01';
      iVar4 = str->bytesmax;
      if (iVar4 <= str->bytesnum) {
        iVar5 = 0x10;
        if (iVar4 != 0) {
          iVar5 = iVar4 * 2;
        }
        str->bytesmax = iVar5;
        puVar7 = (uint8_t *)realloc(str->bytes,(long)iVar5);
        str->bytes = puVar7;
      }
      uVar3 = *val;
      iVar4 = str->bytesnum;
      str->bytesnum = iVar4 + 1;
      str->bytes[iVar4] = (uint8_t)uVar3;
      return 0;
    }
    iVar4 = str->bytesnum;
    iVar5 = str->zero_bytes;
    str->zero_bytes = iVar5 + -1;
    iVar11 = str->bytepos;
    lVar6 = (long)iVar11;
    iVar8 = iVar4;
    if (iVar4 < iVar11) {
      iVar8 = iVar11;
    }
    lVar10 = lVar6 << 0x20;
    do {
      iVar11 = iVar5;
      str->zero_bytes = iVar11;
      if (iVar8 == lVar6) {
        vs_start_cold_5();
        return 1;
      }
      str->bytepos = (int)lVar6 + 1;
      uVar1 = str->bytes[lVar6];
      lVar6 = lVar6 + 1;
      lVar10 = lVar10 + 0x100000000;
      str->curbyte = uVar1;
      iVar5 = iVar11 + 1;
    } while (uVar1 == '\0');
    if (uVar1 == '\x01') {
      if (iVar11 + -1 < 1) {
        vs_start_cold_4();
      }
      else {
        if ((int)lVar6 < iVar4) {
          str->bytepos = (int)lVar6 + 1;
          bVar2 = str->bytes[lVar10 >> 0x20];
          str->curbyte = bVar2;
          str->zero_bytes = 0;
          *val = (uint)bVar2;
          return 0;
        }
        vs_start_cold_3();
      }
    }
    else {
      fprintf(_stderr,"Found byte %08x when searching for a start code!\n");
    }
  }
  else {
    vs_start_cold_2();
  }
  return 1;
}

Assistant:

int vs_start(struct bitstream *str, uint32_t *val) {
	if (str->type == VS_H261 || str->type == VS_H263) {
		int nzbit = (str->type == VS_H261 ? 15 : 16);
		int nsbit = (str->type == VS_H261 ? 4 : 5);
		int bit = 0;
		while (str->zero_bits < nzbit) {
			if (vs_bit(str, &bit)) return 1;
			if (bit != 0) {
				fprintf(stderr, "Found premature 1 bit when searching for a start code!\n");
				return 1;
			}
		}
		while (bit == 0) {
			bit = 1;
			if (vs_bit(str, &bit)) return 1;
		}
		if (vs_u(str, val, nsbit)) return 1;
		return 0;
	} else {
		if (str->bitpos != 7) {
			fprintf (stderr, "Start code attempted at non-bytealigned position\n");
			return 1;
		}
		if (str->dir == VS_ENCODE) {
			ADDARRAY(str->bytes, 0);
			ADDARRAY(str->bytes, 0);
			ADDARRAY(str->bytes, 1);
			ADDARRAY(str->bytes, *val);
		} else {
			str->zero_bytes--;
			do {
				str->zero_bytes++;
				if (str->bytepos >= str->bytesnum) {
					fprintf(stderr, "End of bitstream when searching for a start code!\n");
					return 1;
				}
				str->curbyte = str->bytes[str->bytepos++];
			} while (str->curbyte == 0);
			if (str->curbyte != 1) {
				fprintf(stderr, "Found byte %08x when searching for a start code!\n", str->curbyte);
				return 1;
			}
			if (str->zero_bytes < 2) {
				fprintf(stderr, "Found premature byte %08x when searching for a start code!\n", str->curbyte);
				return 1;
			}
			if (str->bytepos >= str->bytesnum) {
				fprintf(stderr, "End of bitstream when searching for a start code!\n");
				return 1;
			}
			str->curbyte = str->bytes[str->bytepos++];
			str->zero_bytes = 0;
			*val = str->curbyte;
		}
	}
	return 0;
}